

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O0

int __thiscall
ON_TextureMapping::Evaluate(ON_TextureMapping *this,ON_3dPoint *P,ON_3dVector *N,ON_3dPoint *T)

{
  ON_3dVector local_a8;
  ON_3dPoint local_90;
  ON_3dPoint local_78;
  ON_3dPoint local_60;
  ON_3dPoint local_48;
  int local_2c;
  ON_3dPoint *pOStack_28;
  int rc;
  ON_3dPoint *T_local;
  ON_3dVector *N_local;
  ON_3dPoint *P_local;
  ON_TextureMapping *this_local;
  
  pOStack_28 = T;
  T_local = (ON_3dPoint *)N;
  N_local = (ON_3dVector *)P;
  P_local = (ON_3dPoint *)this;
  switch(this->m_type) {
  case srfp_mapping:
    ON_Xform::operator*(&local_48,&this->m_uvw,P);
    pOStack_28->x = local_48.x;
    pOStack_28->y = local_48.y;
    pOStack_28->z = local_48.z;
    local_2c = 1;
    break;
  default:
    local_2c = EvaluatePlaneMapping(this,P,N,T);
    break;
  case cylinder_mapping:
    local_2c = EvaluateCylinderMapping(this,P,N,T);
    break;
  case sphere_mapping:
    local_2c = EvaluateSphereMapping(this,P,N,T);
    break;
  case box_mapping:
    local_2c = EvaluateBoxMapping(this,P,N,T);
    break;
  case mesh_mapping_primitive:
    local_2c = 0;
    break;
  case srf_mapping_primitive:
    local_2c = 0;
    break;
  case brep_mapping_primitive:
    local_2c = 0;
    break;
  case wcs_projection:
    ON_Xform::operator*(&local_60,&this->m_Pxyz,P);
    pOStack_28->x = local_60.x;
    pOStack_28->y = local_60.y;
    pOStack_28->z = local_60.z;
    local_2c = 1;
    break;
  case wcsbox_projection:
    ON_Xform::operator*(&local_90,&this->m_Pxyz,P);
    ON_Xform::operator*(&local_a8,&this->m_Nxyz,(ON_3dVector *)T_local);
    ON_Texture::WcsBoxMapping(&local_78,&local_90,&local_a8);
    pOStack_28->x = local_78.x;
    pOStack_28->y = local_78.y;
    pOStack_28->z = local_78.z;
    local_2c = 1;
  }
  return local_2c;
}

Assistant:

int ON_TextureMapping::Evaluate(
        const ON_3dPoint& P,
        const ON_3dVector& N,
        ON_3dPoint* T
        ) const
{
  int rc;

	switch(m_type)
	{
	case ON_TextureMapping::TYPE::srfp_mapping:
		*T = m_uvw * P; // Do NOT apply m_Pxyz here.
    rc = 1;
		break;
	case ON_TextureMapping::TYPE::sphere_mapping:
		rc = EvaluateSphereMapping(P,N,T);
		break;
	case ON_TextureMapping::TYPE::cylinder_mapping:
		rc = EvaluateCylinderMapping(P,N,T);
		break;
	case ON_TextureMapping::TYPE::box_mapping:
		rc = EvaluateBoxMapping(P,N,T);
		break;

	case ON_TextureMapping::TYPE::mesh_mapping_primitive:
    rc = 0;
		break;

	case ON_TextureMapping::TYPE::srf_mapping_primitive:
    rc = 0;
		break;

	case ON_TextureMapping::TYPE::brep_mapping_primitive:
    rc = 0;
		break;

  case ON_TextureMapping::TYPE::wcs_projection:
    *T = m_Pxyz * P;
    rc = 1;
    break;

  case ON_TextureMapping::TYPE::wcsbox_projection:
    *T = ON_Texture::WcsBoxMapping(m_Pxyz * P, m_Nxyz * N);
    rc = 1;
    break;

	default:
		rc = EvaluatePlaneMapping(P,N,T);
		break;
	}
  return rc;
}